

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

int BN_cmp(BIGNUM *a,BIGNUM *b)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  if (a == (BIGNUM *)0x0 || b == (BIGNUM *)0x0) {
    return -(uint)(a != (BIGNUM *)0x0) | (uint)(b != (BIGNUM *)0x0);
  }
  iVar1 = a->neg;
  uVar5 = -(uint)(iVar1 != 0) | 1;
  if (iVar1 == b->neg) {
    uVar2 = a->top;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 <= b->top) {
      if (b->top <= (int)uVar2) {
        do {
          if ((int)uVar6 < 1) {
            return 0;
          }
          lVar3 = uVar6 - 1;
          lVar4 = uVar6 - 1;
          if (b->d[lVar4] < a->d[lVar3]) {
            return uVar5;
          }
          uVar6 = uVar6 - 1;
        } while (b->d[lVar4] <= a->d[lVar3]);
      }
      return -(uint)(iVar1 == 0) | 1;
    }
  }
  return uVar5;
}

Assistant:

int BN_cmp(const BIGNUM *a, const BIGNUM *b)
{
    int i;
    int gt, lt;
    BN_ULONG t1, t2;

    if ((a == NULL) || (b == NULL)) {
        if (a != NULL)
            return (-1);
        else if (b != NULL)
            return (1);
        else
            return (0);
    }

    bn_check_top(a);
    bn_check_top(b);

    if (a->neg != b->neg) {
        if (a->neg)
            return (-1);
        else
            return (1);
    }
    if (a->neg == 0) {
        gt = 1;
        lt = -1;
    } else {
        gt = -1;
        lt = 1;
    }

    if (a->top > b->top)
        return (gt);
    if (a->top < b->top)
        return (lt);
    for (i = a->top - 1; i >= 0; i--) {
        t1 = a->d[i];
        t2 = b->d[i];
        if (t1 > t2)
            return (gt);
        if (t1 < t2)
            return (lt);
    }
    return (0);
}